

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cc
# Opt level: O2

void __thiscall fasttext::Matrix::divideRow(Matrix *this,Vector *denoms,int64_t ib,int64_t ie)

{
  float fVar1;
  pointer pfVar2;
  ulong uVar3;
  pointer pfVar4;
  ulong uVar5;
  long lVar6;
  int64_t iVar7;
  
  if (ie == -1) {
    ie = this->m_;
  }
  pfVar2 = (denoms->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (ie <= (long)(denoms->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pfVar2 >> 2) {
    uVar3 = this->n_;
    lVar6 = uVar3 * ib * 4;
    for (iVar7 = ib; iVar7 < ie; iVar7 = iVar7 + 1) {
      fVar1 = pfVar2[iVar7 - ib];
      if ((fVar1 != 0.0) || (NAN(fVar1))) {
        pfVar4 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (uVar5 = 0; (~((long)uVar3 >> 0x3f) & uVar3) != uVar5; uVar5 = uVar5 + 1) {
          *(float *)((long)pfVar4 + uVar5 * 4 + lVar6) =
               *(float *)((long)pfVar4 + uVar5 * 4 + lVar6) / fVar1;
        }
      }
      lVar6 = lVar6 + uVar3 * 4;
    }
    return;
  }
  __assert_fail("ie <= denoms.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Lizhen0909[P]LSHVec/src/matrix.cc"
                ,0x4f,"void fasttext::Matrix::divideRow(const Vector &, int64_t, int64_t)");
}

Assistant:

void Matrix::divideRow(const Vector& denoms, int64_t ib, int64_t ie) {
  if (ie == -1) {
    ie = m_;
  }
  assert(ie <= denoms.size());
  for (auto i = ib; i < ie; i++) {
    real n = denoms[i - ib];
    if (n != 0) {
      for (auto j = 0; j < n_; j++) {
        at(i, j) /= n;
      }
    }
  }
}